

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::SurrogatePairPass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  code *pcVar1;
  bool bVar2;
  ScriptConfiguration *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  MatchCharNode *this_01;
  AltNode *pAVar4;
  Node *pNVar5;
  undefined4 *puVar6;
  TrackAllocData local_138;
  int local_10c;
  AltNode *pAStack_108;
  int i_1;
  AltNode *altNodeTail;
  undefined8 local_f8;
  TrackAllocData local_f0;
  AltNode *local_c8;
  AltNode *altNode;
  undefined8 local_b8;
  TrackAllocData local_b0;
  int local_88;
  char local_81;
  int j;
  int iStack_7c;
  bool alreadyAdded;
  int i;
  int indexForNextNode;
  Node *equivNode [4];
  codepoint_t equivClass [4];
  uint local_3c [2];
  uint actualHigh;
  uint tableIndex;
  char16 upper;
  char16 lower;
  bool *previousSurrogatePart_local;
  MatchCharNode *deferredCharNode_local;
  Node **node_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  _tableIndex = previousSurrogatePart;
  previousSurrogatePart_local = (bool *)deferredCharNode;
  deferredCharNode_local = (MatchCharNode *)node;
  node_local = (Node **)this;
  this_00 = Js::ScriptContext::GetConfig(this->scriptContext);
  bVar2 = Js::ScriptConfiguration::IsES6UnicodeExtensionsEnabled(this_00);
  if ((bVar2) && ((this->unicodeFlagPresent & 1U) != 0)) {
    if ((this->currentSurrogatePairNode == (SurrogatePairTracker *)0x0) ||
       (this->currentSurrogatePairNode->location != this->next)) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = SurrogatePairTracker::IsInsideRange(this->currentSurrogatePairNode);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x723,"(!this->currentSurrogatePairNode->IsInsideRange())",
                           "Should not be calling this pass if we are currently inside a range.");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_3c[1] = 0;
      local_3c[0] = 0;
      if (((this->caseInsensitiveFlagPresent & 1U) == 0) ||
         (bVar2 = CaseInsensitive::RangeToEquivClass
                            (local_3c + 1,this->currentSurrogatePairNode->value,
                             this->currentSurrogatePairNode->value,local_3c,
                             (codepoint_t *)(equivNode + 3)), !bVar2)) {
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (this->currentSurrogatePairNode->value,(char16 *)((long)&actualHigh + 2),
                   (char16 *)&actualHigh);
        pNVar5 = CreateSurrogatePairAtom(this,actualHigh._2_2_,(char16)actualHigh);
        (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)pNVar5;
      }
      else {
        iStack_7c = 0;
        for (j = 0; j < 4; j = j + 1) {
          local_81 = '\0';
          for (local_88 = 0; local_88 < j; local_88 = local_88 + 1) {
            if (equivClass[(long)j + -2] == equivClass[(long)local_88 + -2]) {
              local_81 = '\x01';
              break;
            }
          }
          if (local_81 == '\0') {
            bVar2 = Js::NumberUtilities::IsInSupplementaryPlane(equivClass[(long)j + -2]);
            if (bVar2) {
              Js::NumberUtilities::CodePointAsSurrogatePair
                        (equivClass[(long)j + -2],(char16 *)((long)&actualHigh + 2),
                         (char16 *)&actualHigh);
              pNVar5 = CreateSurrogatePairAtom(this,actualHigh._2_2_,(char16)actualHigh);
              *(Node **)(&i + (long)iStack_7c * 2) = pNVar5;
            }
            else {
              pAVar3 = &this->ctAllocator->
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
              Memory::TrackAllocData::CreateTrackAllocData
                        (&local_b0,(type_info *)&MatchCharNode::typeinfo,0,0xffffffffffffffff,
                         "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x743);
              pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                       TrackAllocInfo(pAVar3,&local_b0);
              altNode = (AltNode *)Memory::ArenaAllocator::Alloc;
              local_b8 = 0;
              this_01 = (MatchCharNode *)
                        new<Memory::ArenaAllocator>(0x48,(ArenaAllocator *)pAVar3,0x3f67b0);
              MatchCharNode::MatchCharNode(this_01,(Char)equivClass[(long)j + -2]);
              *(MatchCharNode **)(&i + (long)iStack_7c * 2) = this_01;
            }
            iStack_7c = iStack_7c + 1;
          }
        }
        if (iStack_7c < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x748,"(indexForNextNode > 0)","indexForNextNode > 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if (iStack_7c == 1) {
          (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)_i;
        }
        else {
          pAVar3 = &this->ctAllocator->
                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
          Memory::TrackAllocData::CreateTrackAllocData
                    (&local_f0,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                     "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0x74f);
          pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   TrackAllocInfo(pAVar3,&local_f0);
          altNodeTail = (AltNode *)Memory::ArenaAllocator::Alloc;
          local_f8 = 0;
          pAVar4 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar3,0x3f67b0);
          AltNode::AltNode(pAVar4,_i,(AltNode *)0x0);
          pAStack_108 = pAVar4;
          local_c8 = pAVar4;
          for (local_10c = 1; local_10c < iStack_7c; local_10c = local_10c + 1) {
            pAVar3 = &this->ctAllocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
            Memory::TrackAllocData::CreateTrackAllocData
                      (&local_138,(type_info *)&AltNode::typeinfo,0,0xffffffffffffffff,
                       "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x753);
            pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     TrackAllocInfo(pAVar3,&local_138);
            pAVar4 = (AltNode *)new<Memory::ArenaAllocator>(0x60,(ArenaAllocator *)pAVar3,0x3f67b0);
            AltNode::AltNode(pAVar4,*(Node **)(&i + (long)local_10c * 2),(AltNode *)0x0);
            pAStack_108->tail = pAVar4;
            pAStack_108 = pAStack_108->tail;
          }
          (deferredCharNode_local->super_Node)._vptr_Node = (_func_int **)local_c8;
        }
      }
      *_tableIndex = false;
      bVar2 = ECCanConsume(this,this->currentSurrogatePairNode->length);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x761,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                           "ECCanConsume(this->currentSurrogatePairNode->length)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      ECConsumeMultiUnit(this,this->currentSurrogatePairNode->length);
      UTF8EncodingPolicyBase<false>::RestoreMultiUnits
                (&this->super_UTF8EncodingPolicyBase<false>,
                 this->currentSurrogatePairNode->multiUnits);
      this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser<P, IsLiteral>::SurrogatePairPass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        if (!this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() || !unicodeFlagPresent)
        {
            return false;
        }

        if (this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
        {
            AssertMsg(!this->currentSurrogatePairNode->IsInsideRange(), "Should not be calling this pass if we are currently inside a range.");
            char16 lower, upper;

            uint tableIndex = 0, actualHigh = 0;
            codepoint_t equivClass[CaseInsensitive::EquivClassSize];

            if (caseInsensitiveFlagPresent && CaseInsensitive::RangeToEquivClass(tableIndex, this->currentSurrogatePairNode->value, this->currentSurrogatePairNode->value, actualHigh, equivClass))
            {
                Node *equivNode[CaseInsensitive::EquivClassSize];
                int indexForNextNode = 0;
                for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
                {
                    bool alreadyAdded = false;

                    for (int j = 0; j < i; j++)
                    {
                        if (equivClass[i] == equivClass[j])
                        {
                            alreadyAdded = true;
                            break;
                        }
                    }

                    if (!alreadyAdded)
                    {
                        if (Js::NumberUtilities::IsInSupplementaryPlane(equivClass[i]))
                        {
                            Js::NumberUtilities::CodePointAsSurrogatePair(equivClass[i], &lower, &upper);
                            equivNode[indexForNextNode] = CreateSurrogatePairAtom(lower, upper);
                        }
                        else
                        {
                            equivNode[indexForNextNode] = Anew(ctAllocator, MatchCharNode, (Char)equivClass[i]);
                        }
                        indexForNextNode ++;
                    }
                }
                Assert(indexForNextNode > 0);
                if (indexForNextNode == 1)
                {
                    node = equivNode[0];
                }
                else
                {
                    AltNode *altNode = Anew(ctAllocator, AltNode, equivNode[0], nullptr);
                    AltNode *altNodeTail = altNode;
                    for (int i = 1; i < indexForNextNode; i++)
                    {
                        altNodeTail->tail = Anew(ctAllocator, AltNode, equivNode[i], nullptr);
                        altNodeTail = altNodeTail->tail;
                    }
                    node = altNode;
                }
            }
            else
            {
                Js::NumberUtilities::CodePointAsSurrogatePair(this->currentSurrogatePairNode->value, &lower, &upper);
                node = CreateSurrogatePairAtom(lower, upper);
            }

            previousSurrogatePart = false;

            Assert(ECCanConsume(this->currentSurrogatePairNode->length));
            ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
            this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
            this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;

            return true;
        }

        return false;
    }